

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCircuit.hpp
# Opt level: O2

void __thiscall
qclab::QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_>::QCircuit
          (QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_> *this,int nbQubits,
          int offset,int nbGates)

{
  uint __line;
  char *__assertion;
  allocator_type local_19;
  
  (this->super_QAdjustable).fixed_ = false;
  (this->super_QObject<std::complex<float>_>)._vptr_QObject = (_func_int **)&PTR_nbQubits_004ca500;
  this->nbQubits_ = nbQubits;
  this->offset_ = offset;
  std::
  vector<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>_>_>
  ::vector(&this->gates_,(long)nbGates,&local_19);
  if (nbQubits < 1) {
    __assertion = "nbQubits > 0";
    __line = 0x4c;
  }
  else if (offset < 0) {
    __assertion = "offset >= 0";
    __line = 0x4d;
  }
  else {
    if (-1 < nbGates) {
      return;
    }
    __assertion = "nbGates >= 0";
    __line = 0x4e;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/QCircuit.hpp"
                ,__line,
                "qclab::QCircuit<std::complex<float>>::QCircuit(const int, const int, const int) [T = std::complex<float>, G = qclab::QObject<std::complex<float>>]"
               );
}

Assistant:

QCircuit( const int nbQubits , const int offset , const int nbGates )
      : nbQubits_( nbQubits )
      , offset_( offset )
      , gates_( nbGates )
      {
        assert( nbQubits > 0 ) ;
        assert( offset >= 0 ) ;
        assert( nbGates >= 0 ) ;
      }